

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<const_unsigned_long_&> *this,int *rhs)

{
  bool result;
  char *pcVar1;
  ExpressionResultBuilder *pEVar2;
  ExpressionResultBuilder *in_RDI;
  undefined4 in_stack_000000d8;
  int in_stack_000000dc;
  string *in_stack_ffffffffffffff38;
  ExpressionResultBuilder *in_stack_ffffffffffffff40;
  undefined1 local_81 [33];
  string local_60 [48];
  string local_30 [48];
  
  result = Internal::compare<(Catch::Internal::Operator)0>
                     ((unsigned_long)in_stack_ffffffffffffff40,
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  ExpressionResultBuilder::setResultType(in_RDI,result);
  toString_abi_cxx11_(CONCAT44(in_stack_000000dc,in_stack_000000d8));
  ExpressionResultBuilder::setLhs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  toString_abi_cxx11_(in_stack_000000dc);
  ExpressionResultBuilder::setRhs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pcVar1 = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  pEVar2 = (ExpressionResultBuilder *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_81 + 1),pcVar1,(allocator *)pEVar2);
  pEVar2 = ExpressionResultBuilder::setOp(pEVar2,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return pEVar2;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }